

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageadapterbase.h
# Opt level: O0

void __thiscall bgui::ImageAdapterBase::setRotationFlip(ImageAdapterBase *this,int r,bool f)

{
  long *plVar1;
  long lVar2;
  byte in_DL;
  uint in_ESI;
  long *in_RDI;
  
  *(uint *)((long)in_RDI + 0xc) = in_ESI & 3;
  *(byte *)(in_RDI + 2) = in_DL & 1;
  gmath::SMatrix<long,_2,_3>::operator=((SMatrix<long,_2,_3> *)(in_RDI + 3),0);
  switch(*(undefined4 *)((long)in_RDI + 0xc)) {
  default:
    plVar1 = gmath::SMatrix<long,_2,_3>::operator()((SMatrix<long,_2,_3> *)(in_RDI + 3),0,0);
    *plVar1 = 1;
    plVar1 = gmath::SMatrix<long,_2,_3>::operator()((SMatrix<long,_2,_3> *)(in_RDI + 3),1,1);
    *plVar1 = 1;
    if ((*(byte *)(in_RDI + 2) & 1) != 0) {
      plVar1 = gmath::SMatrix<long,_2,_3>::operator()((SMatrix<long,_2,_3> *)(in_RDI + 3),0,0);
      *plVar1 = -1;
      lVar2 = (**(code **)(*in_RDI + 0x28))();
      plVar1 = gmath::SMatrix<long,_2,_3>::operator()((SMatrix<long,_2,_3> *)(in_RDI + 3),0,2);
      *plVar1 = lVar2 + -1;
    }
    break;
  case 1:
    plVar1 = gmath::SMatrix<long,_2,_3>::operator()((SMatrix<long,_2,_3> *)(in_RDI + 3),0,1);
    *plVar1 = 1;
    plVar1 = gmath::SMatrix<long,_2,_3>::operator()((SMatrix<long,_2,_3> *)(in_RDI + 3),1,0);
    *plVar1 = -1;
    lVar2 = (**(code **)(*in_RDI + 0x30))();
    plVar1 = gmath::SMatrix<long,_2,_3>::operator()((SMatrix<long,_2,_3> *)(in_RDI + 3),1,2);
    *plVar1 = lVar2 + -1;
    if ((*(byte *)(in_RDI + 2) & 1) != 0) {
      plVar1 = gmath::SMatrix<long,_2,_3>::operator()((SMatrix<long,_2,_3> *)(in_RDI + 3),1,0);
      *plVar1 = 1;
      plVar1 = gmath::SMatrix<long,_2,_3>::operator()((SMatrix<long,_2,_3> *)(in_RDI + 3),1,2);
      *plVar1 = 0;
    }
    break;
  case 2:
    plVar1 = gmath::SMatrix<long,_2,_3>::operator()((SMatrix<long,_2,_3> *)(in_RDI + 3),0,0);
    *plVar1 = -1;
    lVar2 = (**(code **)(*in_RDI + 0x28))();
    plVar1 = gmath::SMatrix<long,_2,_3>::operator()((SMatrix<long,_2,_3> *)(in_RDI + 3),0,2);
    *plVar1 = lVar2 + -1;
    plVar1 = gmath::SMatrix<long,_2,_3>::operator()((SMatrix<long,_2,_3> *)(in_RDI + 3),1,1);
    *plVar1 = -1;
    lVar2 = (**(code **)(*in_RDI + 0x30))();
    plVar1 = gmath::SMatrix<long,_2,_3>::operator()((SMatrix<long,_2,_3> *)(in_RDI + 3),1,2);
    *plVar1 = lVar2 + -1;
    if ((*(byte *)(in_RDI + 2) & 1) != 0) {
      plVar1 = gmath::SMatrix<long,_2,_3>::operator()((SMatrix<long,_2,_3> *)(in_RDI + 3),0,0);
      *plVar1 = 1;
      plVar1 = gmath::SMatrix<long,_2,_3>::operator()((SMatrix<long,_2,_3> *)(in_RDI + 3),0,2);
      *plVar1 = 0;
    }
    break;
  case 3:
    plVar1 = gmath::SMatrix<long,_2,_3>::operator()((SMatrix<long,_2,_3> *)(in_RDI + 3),0,1);
    *plVar1 = -1;
    lVar2 = (**(code **)(*in_RDI + 0x28))();
    plVar1 = gmath::SMatrix<long,_2,_3>::operator()((SMatrix<long,_2,_3> *)(in_RDI + 3),0,2);
    *plVar1 = lVar2 + -1;
    plVar1 = gmath::SMatrix<long,_2,_3>::operator()((SMatrix<long,_2,_3> *)(in_RDI + 3),1,0);
    *plVar1 = 1;
    if ((*(byte *)(in_RDI + 2) & 1) != 0) {
      plVar1 = gmath::SMatrix<long,_2,_3>::operator()((SMatrix<long,_2,_3> *)(in_RDI + 3),1,0);
      *plVar1 = -1;
      lVar2 = (**(code **)(*in_RDI + 0x30))();
      plVar1 = gmath::SMatrix<long,_2,_3>::operator()((SMatrix<long,_2,_3> *)(in_RDI + 3),1,2);
      *plVar1 = lVar2 + -1;
    }
  }
  return;
}

Assistant:

void setRotationFlip(int r, bool f)
    {
      rotation=(r & 3);
      flip=f;

      R=0;

      switch (rotation)
      {
        default:
        case 0:
          R(0, 0)=1;
          R(1, 1)=1;

          if (flip)
          {
            R(0, 0)=-1;
            R(0, 2)=getOriginalWidth()-1;
          }

          break;

        case 1:
          R(0, 1)=1;
          R(1, 0)=-1;
          R(1, 2)=getOriginalHeight()-1;

          if (flip)
          {
            R(1, 0)=1;
            R(1, 2)=0;
          }

          break;

        case 2:
          R(0, 0)=-1;
          R(0, 2)=getOriginalWidth()-1;
          R(1, 1)=-1;
          R(1, 2)=getOriginalHeight()-1;

          if (flip)
          {
            R(0, 0)=1;
            R(0, 2)=0;
          }

          break;

        case 3:
          R(0, 1)=-1;
          R(0, 2)=getOriginalWidth()-1;
          R(1, 0)=1;

          if (flip)
          {
            R(1, 0)=-1;
            R(1, 2)=getOriginalHeight()-1;
          }

          break;
      }
    }